

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_engine.cpp
# Opt level: O2

void __thiscall
polyscope::render::backend_openGL3_glfw::GLShaderProgram::assignBufferToVAO
          (GLShaderProgram *this,GLShaderAttribute *a)

{
  int iVar1;
  int iVar2;
  invalid_argument *this_00;
  GLenum GVar3;
  int iVar4;
  long lVar5;
  GLint GVar6;
  GLuint GVar7;
  GLsizei GVar8;
  void *pvVar9;
  void *pvVar10;
  void *pvVar11;
  void *pvVar12;
  void *pvVar13;
  
  (*glad_glBindVertexArray)(this->vaoHandle);
  (*glad_glBindBuffer)
            (0x8892,((a->buff).
                     super___shared_ptr<polyscope::render::backend_openGL3_glfw::GLAttributeBuffer,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr)->VBOLoc);
  checkGLError(true);
  pvVar12 = (void *)0x0;
  pvVar13 = (void *)0x0;
  pvVar10 = (void *)0x0;
  pvVar11 = (void *)0x0;
  lVar5 = 0;
  do {
    if (a->arrayCount <= lVar5) {
      checkGLError(true);
      return;
    }
    iVar4 = (int)lVar5;
    (*glad_glEnableVertexAttribArray)(a->location + iVar4);
    switch(a->type) {
    case Vector2Float:
      iVar1 = a->location;
      iVar2 = a->arrayCount;
      GVar3 = 0x1406;
      goto LAB_00235fa3;
    case Vector3Float:
      iVar1 = a->arrayCount;
      iVar2 = a->location;
      GVar3 = 0x1406;
      goto LAB_00235f87;
    case Vector4Float:
      iVar1 = a->location;
      iVar2 = a->arrayCount;
      GVar3 = 0x1406;
      goto LAB_00235f3e;
    default:
      this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(this_00,"Unrecognized GLShaderAttribute type");
      __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument)
      ;
    case Float:
      GVar7 = a->location + iVar4;
      GVar8 = a->arrayCount << 2;
      GVar3 = 0x1406;
      break;
    case Int:
      GVar7 = a->location + iVar4;
      GVar8 = a->arrayCount << 2;
      GVar3 = 0x1404;
      break;
    case UInt:
      GVar7 = a->location + iVar4;
      GVar8 = a->arrayCount << 2;
      GVar3 = 0x1405;
      break;
    case Vector2UInt:
      iVar1 = a->location;
      iVar2 = a->arrayCount;
      GVar3 = 0x1405;
LAB_00235fa3:
      GVar6 = 2;
      GVar8 = iVar2 << 3;
      GVar7 = iVar1 + iVar4;
      pvVar9 = pvVar10;
      goto LAB_00235fa8;
    case Vector3UInt:
      iVar1 = a->arrayCount;
      iVar2 = a->location;
      GVar3 = 0x1405;
LAB_00235f87:
      GVar6 = 3;
      GVar8 = iVar1 * 0xc;
      GVar7 = iVar2 + iVar4;
      pvVar9 = pvVar13;
      goto LAB_00235fa8;
    case Vector4UInt:
      iVar1 = a->location;
      iVar2 = a->arrayCount;
      GVar3 = 0x1405;
LAB_00235f3e:
      GVar6 = 4;
      GVar8 = iVar2 << 4;
      GVar7 = iVar1 + iVar4;
      pvVar9 = pvVar12;
      goto LAB_00235fa8;
    }
    GVar6 = 1;
    pvVar9 = pvVar11;
LAB_00235fa8:
    (*glad_glVertexAttribPointer)(GVar7,GVar6,GVar3,'\0',GVar8,pvVar9);
    lVar5 = lVar5 + 1;
    pvVar11 = (void *)((long)pvVar11 + 4);
    pvVar10 = (void *)((long)pvVar10 + 8);
    pvVar13 = (void *)((long)pvVar13 + 0xc);
    pvVar12 = (void *)((long)pvVar12 + 0x10);
  } while( true );
}

Assistant:

void GLShaderProgram::assignBufferToVAO(GLShaderAttribute& a) {
  bindVAO();
  a.buff->bind();
  checkGLError();

  // Choose the correct type for the buffer
  for (int iArrInd = 0; iArrInd < a.arrayCount; iArrInd++) {

    glEnableVertexAttribArray(a.location + iArrInd);

    switch (a.type) {
    case RenderDataType::Float:
      glVertexAttribPointer(a.location + iArrInd, 1, GL_FLOAT, GL_FALSE, sizeof(float) * 1 * a.arrayCount,
                            reinterpret_cast<void*>(sizeof(float) * 1 * iArrInd));
      break;
    case RenderDataType::Int:
      glVertexAttribPointer(a.location + iArrInd, 1, GL_INT, GL_FALSE, sizeof(int) * 1 * a.arrayCount,
                            reinterpret_cast<void*>(sizeof(int) * 1 * iArrInd));
      break;
    case RenderDataType::UInt:
      glVertexAttribPointer(a.location + iArrInd, 1, GL_UNSIGNED_INT, GL_FALSE, sizeof(uint32_t) * 1 * a.arrayCount,
                            reinterpret_cast<void*>(sizeof(uint32_t) * 1 * iArrInd));
      break;
    case RenderDataType::Vector2Float:
      glVertexAttribPointer(a.location + iArrInd, 2, GL_FLOAT, GL_FALSE, sizeof(float) * 2 * a.arrayCount,
                            reinterpret_cast<void*>(sizeof(float) * 2 * iArrInd));
      break;
    case RenderDataType::Vector3Float:
      glVertexAttribPointer(a.location + iArrInd, 3, GL_FLOAT, GL_FALSE, sizeof(float) * 3 * a.arrayCount,
                            reinterpret_cast<void*>(sizeof(float) * 3 * iArrInd));
      break;
    case RenderDataType::Vector4Float:
      glVertexAttribPointer(a.location + iArrInd, 4, GL_FLOAT, GL_FALSE, sizeof(float) * 4 * a.arrayCount,
                            reinterpret_cast<void*>(sizeof(float) * 4 * iArrInd));
      break;
    case RenderDataType::Vector2UInt:
      glVertexAttribPointer(a.location + iArrInd, 2, GL_UNSIGNED_INT, GL_FALSE, sizeof(uint32_t) * 2 * a.arrayCount,
                            reinterpret_cast<void*>(sizeof(uint32_t) * 2 * iArrInd));
      break;
    case RenderDataType::Vector3UInt:
      glVertexAttribPointer(a.location + iArrInd, 3, GL_UNSIGNED_INT, GL_FALSE, sizeof(uint32_t) * 3 * a.arrayCount,
                            reinterpret_cast<void*>(sizeof(uint32_t) * 3 * iArrInd));
      break;
    case RenderDataType::Vector4UInt:
      glVertexAttribPointer(a.location + iArrInd, 4, GL_UNSIGNED_INT, GL_FALSE, sizeof(uint32_t) * 4 * a.arrayCount,
                            reinterpret_cast<void*>(sizeof(uint32_t) * 4 * iArrInd));
      break;
    default:
      throw std::invalid_argument("Unrecognized GLShaderAttribute type");
      break;
    }
  }

  checkGLError();
}